

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

void __thiscall
llvm::cl::
apply<llvm::cl::opt<(anonymous_namespace)::HelpPrinter,true,llvm::cl::parser<bool>>,llvm::cl::desc,llvm::cl::LocationClass<(anonymous_namespace)::HelpPrinter>,llvm::cl::OptionHidden,llvm::cl::ValueExpected,llvm::cl::cat,llvm::cl::sub>
          (cl *this,opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> *O,
          desc *M,LocationClass<(anonymous_namespace)::HelpPrinter> *Ms,OptionHidden *Ms_1,
          ValueExpected *Ms_2,cat *Ms_3,sub *Ms_4)

{
  undefined4 uVar1;
  SubCommand *Ptr;
  ushort uVar2;
  raw_ostream *Errs;
  Twine TStack_48;
  
  *(opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> **)(this + 0x28) = O;
  *(desc **)(this + 0x30) = M;
  if (*(long *)(this + 0x98) == 0) {
    *(HelpPrinter **)(this + 0x98) = Ms->Loc;
  }
  else {
    Twine::Twine(&TStack_48,"cl::location(x) specified more than once!");
    Errs = errs();
    Option::error((Option *)this,&TStack_48,(StringRef)ZEXT816(0),Errs);
  }
  uVar1 = *(undefined4 *)(this + 0xc);
  uVar2 = (ushort)((*Ms_1 & (ReallyHidden|Hidden)) << 5);
  *(ushort *)(this + 0xc) = (ushort)uVar1 & 0xff9f | uVar2;
  *(ushort *)(this + 0xc) = ((ushort)uVar1 & 0xff87 | uVar2) + ((ushort)*Ms_2 & 3) * 8;
  Ptr = Ms_4->Sub;
  *(OptionCategory **)(this + 0x48) = Ms_3->Category;
  SmallPtrSetImpl<llvm::cl::SubCommand_*>::insert
            ((pair<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>,_bool> *)&TStack_48,
             (SmallPtrSetImpl<llvm::cl::SubCommand_*> *)(this + 0x50),Ptr);
  return;
}

Assistant:

void apply(Opt *O, const Mod &M, const Mods &... Ms) {
  applicator<Mod>::opt(M, *O);
  apply(O, Ms...);
}